

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  bool bVar2;
  ImDrawChannel *pIVar3;
  int local_24;
  int i;
  int old_channels_count;
  int channels_count_local;
  ImDrawList *draw_list_local;
  ImDrawListSplitter *this_local;
  
  bVar2 = false;
  if ((this->_Current == 0) && (bVar2 = false, this->_Count < 2)) {
    bVar2 = true;
  }
  if (!bVar2) {
    __assert_fail("_Current == 0 && _Count <= 1 && \"Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_draw.cpp"
                  ,0x69d,"void ImDrawListSplitter::Split(ImDrawList *, int)");
  }
  iVar1 = (this->_Channels).Size;
  if (iVar1 < channels_count) {
    ImVector<ImDrawChannel>::reserve(&this->_Channels,channels_count);
    ImVector<ImDrawChannel>::resize(&this->_Channels,channels_count);
  }
  this->_Count = channels_count;
  pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,0);
  memset(pIVar3,0,0x20);
  for (local_24 = 1; local_24 < channels_count; local_24 = local_24 + 1) {
    if (local_24 < iVar1) {
      pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      ImVector<ImDrawCmd>::resize(&pIVar3->_CmdBuffer,0);
      pIVar3 = ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      ImVector<unsigned_short>::resize(&pIVar3->_IdxBuffer,0);
    }
    else {
      ImVector<ImDrawChannel>::operator[](&this->_Channels,local_24);
      pIVar3 = (ImDrawChannel *)operator_new(0x20);
      (pIVar3->_IdxBuffer).Size = 0;
      (pIVar3->_IdxBuffer).Capacity = 0;
      (pIVar3->_IdxBuffer).Data = (unsigned_short *)0x0;
      (pIVar3->_CmdBuffer).Size = 0;
      (pIVar3->_CmdBuffer).Capacity = 0;
      (pIVar3->_CmdBuffer).Data = (ImDrawCmd *)0x0;
      ImDrawChannel::ImDrawChannel(pIVar3);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}